

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::Divide
          (TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,
          TPZVec<TPZGeoEl_*> *SubElVec)

{
  TPZReference *pTVar1;
  _Base_ptr p_Var2;
  TPZVec<TPZGeoEl_*> *pTVar3;
  MElementType elType;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 uVar8;
  TPZRefPatternDataBase *pTVar9;
  TPZGeoEl *pTVar10;
  undefined8 uVar11;
  long lVar12;
  long *plVar13;
  TPZGeoEl *pTVar14;
  TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *pTVar15;
  uint uVar16;
  uint iel;
  ulong uVar17;
  uint uVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  TPZGeoElSide neighbour;
  TPZGeoElSide gs;
  TPZAutoPointer<TPZRefPattern> uniform;
  int64_t index;
  TPZManVector<long,_30> np;
  TPZGeoElSide local_2b0;
  _func_int **local_298;
  undefined **local_290;
  TPZReference *local_288;
  TPZAutoPointer<TPZRefPattern> local_280;
  TPZVec<TPZGeoEl_*> *local_278;
  TPZGeoElSide local_270;
  undefined1 local_258 [272];
  undefined1 local_148 [8];
  undefined1 local_140 [272];
  _func_int **pp_Var18;
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0))
  goto LAB_00f7d381;
  elType = (**(code **)(*(long *)&(this->
                                  super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                  ).super_TPZGeoEl + 0xb8))(this);
  if (elType == EPoint) {
    return;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)local_140,0x1a5a5d0);
  if ((TPZRefPatternDataBase *)local_140._0_8_ == (TPZRefPatternDataBase *)0x0) {
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
LAB_00f7d2ac:
    TPZRefPatternDataBase::InitializeUniformRefPattern(&gRefDBase,elType);
  }
  else {
    lVar12 = *(long *)&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                          *)local_140._0_8_)->_M_t)._M_impl;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
    if (lVar12 == 0) goto LAB_00f7d2ac;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)local_258,0x1a5a5d0);
  local_140._16_8_ = (_Base_ptr)0x0;
  local_140._0_8_ = (TPZRefPatternDataBase *)local_140;
  local_140._8_8_ = (TPZRefPatternDataBase *)local_140;
  TPZRefPatternTools::GetCompatibleRefPatterns
            ((TPZGeoEl *)this,
             (list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> *
             )local_140);
  pTVar9 = (TPZRefPatternDataBase *)local_140;
  do {
    pTVar9 = *(TPZRefPatternDataBase **)&(pTVar9->fElTypeRefPatterns)._M_t._M_impl;
    if (pTVar9 == (TPZRefPatternDataBase *)local_140) goto LAB_00f7d407;
    p_Var2 = (pTVar9->fElTypeRefPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 == (_Base_ptr)0x0) {
      bVar21 = false;
    }
    else {
      bVar21 = *(long *)p_Var2 != 0;
    }
    if ((TPZReference *)local_258._0_8_ == (TPZReference *)0x0) {
      bVar22 = false;
    }
    else {
      bVar22 = *(TPZRefPattern **)local_258._0_8_ != (TPZRefPattern *)0x0;
    }
  } while (bVar21 != bVar22);
  if (pTVar9 == (TPZRefPatternDataBase *)local_140) {
LAB_00f7d407:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!",0x46);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    (*SubElVec->_vptr_TPZVec[3])(SubElVec,0);
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
              *)local_140);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
    return;
  }
  local_280.fRef = (TPZReference *)local_258._0_8_;
  LOCK();
  (((atomic_int *)(local_258._0_8_ + 8))->super___atomic_base<int>)._M_i =
       (((atomic_int *)(local_258._0_8_ + 8))->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>).
                         super_TPZGeoEl + 0x2a8))(this);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_280);
  std::__cxx11::
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
  _M_clear((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            *)local_140);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
LAB_00f7d381:
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>).
                         super_TPZGeoEl + 0x2b0))(local_140,this);
  uVar4 = TPZRefPattern::NSubElements
                    (*(TPZRefPattern **)
                      &(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                          *)local_140._0_8_)->_M_t)._M_impl);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
  iVar5 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                 ).super_TPZGeoEl + 0x1d0))(this);
  if (iVar5 == 0) {
    iVar5 = (this->super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>).
            super_TPZGeoEl.fMatId;
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                           ).super_TPZGeoEl + 0x2b0))(local_140,this);
    iVar6 = TPZRefPattern::NNodes
                      (*(TPZRefPattern **)
                        &(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                            *)local_140._0_8_)->_M_t)._M_impl);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
    local_258._0_8_ = (TPZReference *)0x0;
    TPZManVector<long,_30>::TPZManVector
              ((TPZManVector<long,_30> *)local_140,(long)iVar6,(long *)local_258);
    iVar6 = (**(code **)(*(long *)&(this->
                                   super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                   ).super_TPZGeoEl + 0x98))(this);
    local_278 = SubElVec;
    if (0 < iVar6) {
      iVar20 = 0;
      do {
        uVar11 = (**(code **)(*(long *)&(this->
                                        super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                        ).super_TPZGeoEl + 0xa8))(this,iVar20);
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                               ).super_TPZGeoEl + 0x2b0))
                  ((TPZAutoPointer<TPZRefPattern> *)local_258);
        pTVar10 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,0);
        lVar12 = (**(code **)(*(long *)pTVar10 + 0xa8))(pTVar10,iVar20);
        *(undefined8 *)
         (&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
              *)local_140._8_8_)->_M_t)._M_impl.field_0x0 + lVar12 * 8) = uVar11;
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
        iVar20 = iVar20 + 1;
      } while (iVar6 != iVar20);
    }
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                           ).super_TPZGeoEl + 0x2b0))(local_258,this);
    TPZRefPattern::CreateNewNodes
              (*(TPZRefPattern **)local_258._0_8_,(TPZGeoEl *)this,(TPZVec<long> *)local_140);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
    if (0 < (int)uVar4) {
      uVar16 = 0;
      local_290 = &PTR__TPZManVector_018aa1c0;
      local_288 = (TPZReference *)&PTR__TPZVec_0183b5f0;
      do {
        pp_Var18 = (_func_int **)(ulong)uVar16;
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                               ).super_TPZGeoEl + 0x2b0))((TPZManVector<long,_30> *)local_258,this);
        uVar16 = uVar16 + 1;
        local_298 = pp_Var18;
        pTVar10 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,uVar16);
        uVar7 = (**(code **)(*(long *)pTVar10 + 0x98))(pTVar10);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
        TPZManVector<long,_30>::TPZManVector((TPZManVector<long,_30> *)local_258,(long)(int)uVar7);
        if (0 < (int)uVar7) {
          uVar17 = 0;
          do {
            (**(code **)(*(long *)&(this->
                                   super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                   ).super_TPZGeoEl + 0x2b0))(&local_2b0);
            pTVar10 = TPZRefPattern::Element
                                ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,
                                 uVar16);
            lVar12 = (**(code **)(*(long *)pTVar10 + 0xa8))(pTVar10,uVar17 & 0xffffffff);
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
            *(undefined8 *)((undefined1 *)local_258._8_8_ + uVar17 * 8) =
                 *(undefined8 *)
                  (&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                       *)local_140._8_8_)->_M_t)._M_impl.field_0x0 + lVar12 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                               ).super_TPZGeoEl + 0x2b0))(&local_2b0,this);
        pTVar10 = TPZRefPattern::Element
                            ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,uVar16);
        uVar8 = (**(code **)(*(long *)pTVar10 + 0xb8))(pTVar10);
        uVar11 = (**(code **)(*(long *)&(this->
                                        super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                        ).super_TPZGeoEl + 0x168))
                           (this,uVar8,(TPZManVector<long,_30> *)local_258,iVar5,local_148);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                               ).super_TPZGeoEl + 0x1b0))(this,local_298,uVar11);
        if ((TPZGeoEl *)local_258._8_8_ == (TPZGeoEl *)(local_258 + 0x20)) {
          local_258._8_8_ = (TPZGeoEl *)0x0;
        }
        local_258._24_8_ = (_Base_ptr)0x0;
        local_258._0_8_ = local_288;
        if ((TPZGeoEl *)local_258._8_8_ != (TPZGeoEl *)0x0) {
          operator_delete__((void *)local_258._8_8_);
        }
      } while (uVar16 != uVar4);
    }
    pTVar3 = local_278;
    (*local_278->_vptr_TPZVec[3])(local_278,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar17 = 0;
      do {
        pTVar10 = (TPZGeoEl *)
                  (**(code **)(*(long *)&(this->
                                         super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                         ).super_TPZGeoEl + 0x1f8))(this,uVar17 & 0xffffffff);
        pTVar3->fStore[uVar17] = pTVar10;
        pTVar10 = pTVar3->fStore[uVar17];
        pTVar10->fFatherIndex =
             (this->super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>).
             super_TPZGeoEl.fIndex;
        (**(code **)(*(long *)pTVar10 + 0x1f0))();
        uVar17 = uVar17 + 1;
      } while (uVar4 != uVar17);
    }
    if (0 < (int)uVar4) {
      local_298 = (_func_int **)&PTR__TPZGeoElSide_01920090;
      uVar16 = 0;
      do {
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                               ).super_TPZGeoEl + 0x2b0))(local_258,this);
        uVar7 = uVar16 + 1;
        pTVar10 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,uVar7);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
        for (iVar5 = 0; iVar6 = (**(code **)(*(long *)pTVar10 + 0xf0))(pTVar10), iVar5 < iVar6;
            iVar5 = iVar5 + 1) {
          (**(code **)(*(long *)pTVar10 + 0x188))(local_258,pTVar10,iVar5);
          if (((int)local_258._16_4_ < 0 || (TPZGeoEl *)local_258._8_8_ == (TPZGeoEl *)0x0) ||
             ((TPZGeoEl *)local_258._8_8_ == pTVar10 && local_258._16_4_ == iVar5)) {
            plVar13 = (long *)(**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                                  ).super_TPZGeoEl + 0x1f8))(this,uVar16);
            local_2b0.fGeoEl =
                 (TPZGeoEl *)
                 (**(code **)(*(long *)&(this->
                                        super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                        ).super_TPZGeoEl + 0x1f8))(this,uVar16);
            local_2b0.super_TPZSavable._vptr_TPZSavable = local_298;
            local_2b0.fSide = iVar5;
            (**(code **)(*plVar13 + 0x198))(plVar13,iVar5,&local_2b0);
          }
          else {
            uVar19 = 0xffffffff;
            do {
              (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                     ).super_TPZGeoEl + 0x2b0))(&local_2b0,this);
              iel = uVar19 + 1;
              pTVar14 = TPZRefPattern::Element
                                  ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,iel
                                  );
              bVar21 = pTVar14 == (TPZGeoEl *)local_258._8_8_;
              TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
              if (uVar16 != uVar19 && bVar21) {
                local_2b0.super_TPZSavable._vptr_TPZSavable = local_298;
                local_2b0.fGeoEl = (TPZGeoEl *)0x0;
                local_2b0.fSide = -1;
                pTVar15 = this;
                if (uVar19 != 0xffffffff) {
                  pTVar15 = (TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                             *)(**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                                  ).super_TPZGeoEl + 0x1f8))(this,uVar19);
                }
                local_2b0.fSide = local_258._16_4_;
                local_2b0.fGeoEl = (TPZGeoEl *)pTVar15;
                local_270.fGeoEl =
                     (TPZGeoEl *)
                     (**(code **)(*(long *)&(this->
                                            super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                            ).super_TPZGeoEl + 0x1f8))(this,uVar16);
                local_270.super_TPZSavable._vptr_TPZSavable = local_298;
                local_270.fSide = iVar5;
                iVar6 = TPZGeoElSide::NeighbourExists(&local_270,&local_2b0);
                if (iVar6 == 0) {
                  TPZGeoElSide::SetConnectivity(&local_270,&local_2b0);
                }
                break;
              }
              uVar19 = iel;
            } while (uVar4 != iel);
          }
        }
        uVar16 = uVar7;
      } while (uVar7 != uVar4);
    }
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                           ).super_TPZGeoEl + 0x1b8))(this);
    if ((TPZRefPatternDataBase *)local_140._8_8_ == (TPZRefPatternDataBase *)(local_140 + 0x20)) {
      local_140._8_8_ = (TPZRefPatternDataBase *)0x0;
    }
    local_140._24_8_ = (_Base_ptr)0x0;
    local_140._0_8_ = &PTR__TPZVec_0183b5f0;
    if ((TPZRefPatternDataBase *)local_140._8_8_ != (TPZRefPatternDataBase *)0x0) {
      operator_delete__((void *)local_140._8_8_);
    }
  }
  else {
    (*SubElVec->_vptr_TPZVec[3])(SubElVec,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar17 = 0;
      do {
        pTVar10 = (TPZGeoEl *)
                  (**(code **)(*(long *)&(this->
                                         super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>
                                         ).super_TPZGeoEl + 0x1f8))(this,uVar17 & 0xffffffff);
        SubElVec->fStore[uVar17] = pTVar10;
        uVar17 = uVar17 + 1;
      } while (uVar4 != uVar17);
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Divide(TPZVec<TPZGeoEl *> &SubElVec){
	if (!fRefPattern) {
		MElementType typeel = this->Type();
		if(typeel == EPoint)
			return;
		if(!gRefDBase.GetUniformRefPattern(typeel))
		{
			gRefDBase.InitializeUniformRefPattern(typeel);
		}
		TPZAutoPointer<TPZRefPattern> uniform = gRefDBase.GetUniformRefPattern(typeel);
		std::list<TPZAutoPointer<TPZRefPattern> > compat;
		TPZRefPatternTools::GetCompatibleRefPatterns(this,compat);
		std::list<TPZAutoPointer<TPZRefPattern> >::iterator it = compat.begin();
		while(it != compat.end()){
			if(*it == uniform) break;
			it++;
		}
		if(it != compat.end())
		{
			this->SetRefPattern(uniform);
		}
		else
		{
			PZError << "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!" << std::endl;
			SubElVec.Resize(0);
			return;
		}
	}
	int i;
	int NSubEl = this->GetRefPattern()->NSubElements();
	if(HasSubElement()) {
		SubElVec.Resize(NSubEl);
		for(i=0;i<NSubEl;i++) SubElVec[i] = SubElement(i);
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if(loggerrefpattern.isWarnEnabled())
		{
			std::stringstream sout;
			sout << "Trying to divide element which has subelements " << this->Index() << std::endl;
			sout << "Subelement indices ";
			for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
			LOGPZ_WARN(loggerrefpattern,sout.str());
		}
#endif
		return;//If exist fSubEl return this sons
	}
	int64_t index;
	int j, k, sub, matid=this->MaterialId();
	
	int64_t totalnodes = this->GetRefPattern()->NNodes();
	TPZManVector<int64_t,30> np(totalnodes,0);
	int nnodes = this->NCornerNodes();
	
	for(j=0;j<nnodes;j++) {
		np[this->GetRefPattern()->Element(0)->NodeIndex(j)] = this->NodeIndex(j);
	}
	this->GetRefPattern()->CreateNewNodes (this, np);
	//std::cout << "NewNodeIndexes : " << np << std::endl;
	
	// creating new subelements
	for(i=0;i<NSubEl;i++) {
		int subcorner = this->GetRefPattern()->Element(i+1)->NCornerNodes();
		TPZManVector<int64_t,30> cornerindexes(subcorner);
		for(j=0;j<subcorner;j++) {
			int64_t cornerid = this->GetRefPattern()->Element(i+1)->NodeIndex(j);
			cornerindexes[j] = np[cornerid];
		}
		//std::cout << "Subel corner " << cornerindexes << std::endl;
		TPZGeoEl *subel = this->CreateGeoElement((MElementType)this->GetRefPattern()->Element(i+1)->Type(),cornerindexes,matid,index);
		SetSubElement(i,subel);
	}
	
	SubElVec.Resize(NSubEl);
	for(sub=0;sub<NSubEl;sub++) {
		SubElVec[sub] = SubElement(sub);
		SubElVec[sub]->SetFather(this);
		SubElVec[sub]->SetFatherIndex(this->fIndex);
	}

	for(i=0;i<NSubEl;i++) {
		//std::cout << "SubElement " << i << std::endl;
		TPZGeoEl *refsubel = this->GetRefPattern()->Element(i+1);
		for (j=0;j<refsubel->NSides();j++){
			//std::cout << "\t Side " << j << std::endl;
			TPZGeoElSide thisside (refsubel,j);
			TPZGeoElSide refneigh = refsubel->Neighbour(j);
			if(refneigh.Exists() && refneigh != thisside) {
				//como nao me deixam guardar o index do elemento geometrico...
				for (k=0;k<NSubEl+1;k++){
					if (this->GetRefPattern()->Element(k) == refneigh.Element() && k-1 != i){
						//    std::cout << "\t\t\tFound subel " << k << "  side of subel " << refneigh.Side()
						//      << "For subelement " << i << " side " << j << std::endl;
						TPZGeoElSide neighbour;
						if(k) {
							neighbour = TPZGeoElSide(SubElement(k-1),refneigh.Side());
						} else {
							neighbour = TPZGeoElSide(this, refneigh.Side());
						}
						TPZGeoElSide gs(SubElement(i),j);
						if(!gs.NeighbourExists(neighbour)) gs.SetConnectivity(neighbour);
						break;
					}
				}
				if(k == NSubEl+1) {
					//std::cout << "TPZGeoElRefPattern<TGeo>::Divide inconsistent datastructure subelement "
					//  << i << " Side " << j << std::endl;
				}
			} else {
				SubElement(i)->SetNeighbour(j,TPZGeoElSide(SubElement(i),j));
			}
		}
	}
	
	this->SetSubElementConnectivities();
#ifdef PZ_LOG
    {
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if (loggerrefpattern.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Dividing element " << this->Index() << std::endl;
            sout << "Subelement indices ";
            for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
            LOGPZ_DEBUG(loggerrefpattern,sout.str())
        }
    }
#endif
}